

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_rowcol_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint uVar13;
  undefined1 auVar14 [32];
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  char *__format;
  int iVar29;
  ulong uVar30;
  ushort uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  long lVar45;
  ulong uVar46;
  short sVar47;
  int iVar48;
  ulong uVar49;
  ulong uVar50;
  int16_t iVar51;
  undefined2 uVar52;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  ulong local_388;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  ulong local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  int16_t *local_2a8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  short local_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short sStack_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short sStack_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  undefined2 local_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined2 uStack_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined1 local_e0 [32];
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined1 local_80 [32];
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar22 = "_s2";
  }
  else {
    uVar46 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar22 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar22 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar22 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar22 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_007b35b8:
        iVar18 = matrix->min;
        iVar48 = -iVar18;
        if (iVar18 != -open && SBORROW4(iVar18,-open) == iVar18 + open < 0) {
          iVar48 = open;
        }
        uVar26 = iVar48 - 0x7fff;
        sVar47 = 0x7ffe - (short)matrix->max;
        iVar51 = (int16_t)uVar26;
        local_140._2_2_ = iVar51;
        local_140._0_2_ = iVar51;
        local_140._4_2_ = iVar51;
        local_140._6_2_ = iVar51;
        local_140._8_2_ = iVar51;
        local_140._10_2_ = iVar51;
        local_140._12_2_ = iVar51;
        local_140._14_2_ = iVar51;
        local_140._16_2_ = iVar51;
        local_140._18_2_ = iVar51;
        local_140._20_2_ = iVar51;
        local_140._22_2_ = iVar51;
        local_140._24_2_ = iVar51;
        local_140._26_2_ = iVar51;
        local_140._28_2_ = iVar51;
        local_140._30_2_ = iVar51;
        local_1a0._2_2_ = iVar51;
        local_1a0._0_2_ = iVar51;
        local_1a0._4_2_ = iVar51;
        local_1a0._6_2_ = iVar51;
        local_1a0._8_2_ = iVar51;
        local_1a0._10_2_ = iVar51;
        local_1a0._12_2_ = iVar51;
        local_1a0._14_2_ = iVar51;
        local_1a0._16_2_ = iVar51;
        local_1a0._18_2_ = iVar51;
        local_1a0._20_2_ = iVar51;
        local_1a0._22_2_ = iVar51;
        local_1a0._24_2_ = iVar51;
        local_1a0._26_2_ = iVar51;
        local_1a0._28_2_ = iVar51;
        local_1a0._30_2_ = iVar51;
        local_1c0._2_2_ = iVar51;
        local_1c0._0_2_ = iVar51;
        local_1c0._4_2_ = iVar51;
        local_1c0._6_2_ = iVar51;
        local_1c0._8_2_ = iVar51;
        local_1c0._10_2_ = iVar51;
        local_1c0._12_2_ = iVar51;
        local_1c0._14_2_ = iVar51;
        local_1c0._16_2_ = iVar51;
        local_1c0._18_2_ = iVar51;
        local_1c0._20_2_ = iVar51;
        local_1c0._22_2_ = iVar51;
        local_1c0._24_2_ = iVar51;
        local_1c0._26_2_ = iVar51;
        local_1c0._28_2_ = iVar51;
        local_1c0._30_2_ = iVar51;
        ppVar19 = parasail_result_new_rowcol1(_s1Len,s2Len);
        if (ppVar19 != (parasail_result_t *)0x0) {
          ppVar19->flag = ppVar19->flag | 0x10241004;
          uVar27 = (ulong)(s2Len + 0x1e);
          ptr = parasail_memalign_int16_t(0x20,uVar27);
          ptr_00 = parasail_memalign_int16_t(0x20,uVar27);
          ptr_01 = parasail_memalign_int16_t(0x20,uVar27);
          if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
            lVar45 = (long)_s1Len;
            if (matrix->type == 0) {
              local_2a8 = parasail_memalign_int16_t(0x20,(long)(int)(_s1Len + 0xf));
              if (local_2a8 == (int16_t *)0x0) {
                return (parasail_result_t *)0x0;
              }
              for (uVar27 = 0; lVar23 = lVar45, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar27;
                  uVar27 = uVar27 + 1) {
                local_2a8[uVar27] = (int16_t)matrix->mapper[(byte)_s1[uVar27]];
              }
              for (; lVar23 < (int)(_s1Len + 0xf); lVar23 = lVar23 + 1) {
                local_2a8[lVar23] = 0;
              }
            }
            else {
              local_2a8 = (int16_t *)0x0;
            }
            uVar20 = s2Len + 0xf;
            local_120 = sVar47;
            sStack_11e = sVar47;
            sStack_11c = sVar47;
            sStack_11a = sVar47;
            sStack_118 = sVar47;
            sStack_116 = sVar47;
            sStack_114 = sVar47;
            sStack_112 = sVar47;
            sStack_110 = sVar47;
            sStack_10e = sVar47;
            sStack_10c = sVar47;
            sStack_10a = sVar47;
            sStack_108 = sVar47;
            sStack_106 = sVar47;
            sStack_104 = sVar47;
            sStack_102 = sVar47;
            auVar55._2_2_ = iVar51;
            auVar55._0_2_ = iVar51;
            auVar55._4_2_ = iVar51;
            auVar55._6_2_ = iVar51;
            auVar55._8_2_ = iVar51;
            auVar55._10_2_ = iVar51;
            auVar55._12_2_ = iVar51;
            auVar55._14_2_ = iVar51;
            auVar10._16_2_ = iVar51;
            auVar10._0_16_ = auVar55;
            auVar10._18_2_ = iVar51;
            auVar10._20_2_ = iVar51;
            auVar10._22_2_ = iVar51;
            auVar10._24_2_ = iVar51;
            auVar10._26_2_ = iVar51;
            auVar10._28_2_ = iVar51;
            auVar10._30_2_ = iVar51;
            auVar53 = vpslldq_avx2(ZEXT1632(auVar55),0xe);
            local_e0 = vpblendw_avx2(auVar10,auVar53,0x80);
            local_a0 = (undefined2)open;
            uStack_9e = local_a0;
            uStack_9c = local_a0;
            uStack_9a = local_a0;
            uStack_98 = local_a0;
            uStack_96 = local_a0;
            uStack_94 = local_a0;
            uStack_92 = local_a0;
            uStack_90 = local_a0;
            uStack_8e = local_a0;
            uStack_8c = local_a0;
            uStack_8a = local_a0;
            uStack_88 = local_a0;
            uStack_86 = local_a0;
            uStack_84 = local_a0;
            uStack_82 = local_a0;
            uVar52 = (undefined2)gap;
            auVar53._2_2_ = uVar52;
            auVar53._0_2_ = uVar52;
            auVar53._4_2_ = uVar52;
            auVar53._6_2_ = uVar52;
            auVar53._8_2_ = uVar52;
            auVar53._10_2_ = uVar52;
            auVar53._12_2_ = uVar52;
            auVar53._14_2_ = uVar52;
            auVar53._16_2_ = uVar52;
            auVar53._18_2_ = uVar52;
            auVar53._20_2_ = uVar52;
            auVar53._22_2_ = uVar52;
            auVar53._24_2_ = uVar52;
            auVar53._26_2_ = uVar52;
            auVar53._28_2_ = uVar52;
            auVar53._30_2_ = uVar52;
            local_100 = (undefined2)_s1Len;
            uStack_fe = local_100;
            uStack_fc = local_100;
            uStack_fa = local_100;
            uStack_f8 = local_100;
            uStack_f6 = local_100;
            uStack_f4 = local_100;
            uStack_f2 = local_100;
            uStack_f0 = local_100;
            uStack_ee = local_100;
            uStack_ec = local_100;
            uStack_ea = local_100;
            uStack_e8 = local_100;
            uStack_e6 = local_100;
            uStack_e4 = local_100;
            uStack_e2 = local_100;
            local_c0 = (undefined2)s2Len;
            uStack_be = local_c0;
            uStack_bc = local_c0;
            uStack_ba = local_c0;
            uStack_b8 = local_c0;
            uStack_b6 = local_c0;
            uStack_b4 = local_c0;
            uStack_b2 = local_c0;
            uStack_b0 = local_c0;
            uStack_ae = local_c0;
            uStack_ac = local_c0;
            uStack_aa = local_c0;
            uStack_a8 = local_c0;
            uStack_a6 = local_c0;
            uStack_a4 = local_c0;
            uStack_a2 = local_c0;
            piVar3 = matrix->mapper;
            for (uVar27 = 0; uVar46 != uVar27; uVar27 = uVar27 + 1) {
              ptr[uVar27 + 0xf] = (int16_t)piVar3[(byte)_s2[uVar27]];
            }
            for (lVar23 = 0; uVar27 = uVar46, lVar23 != 0xf; lVar23 = lVar23 + 1) {
              ptr[lVar23] = 0;
            }
            for (; (int)uVar27 < (int)uVar20; uVar27 = uVar27 + 1) {
              ptr[uVar27 + 0xf] = 0;
            }
            for (uVar27 = 0; uVar46 != uVar27; uVar27 = uVar27 + 1) {
              ptr_00[uVar27 + 0xf] = 0;
              ptr_01[uVar27 + 0xf] = iVar51;
            }
            for (lVar23 = 0; uVar27 = uVar46, lVar23 != 0xf; lVar23 = lVar23 + 1) {
              ptr_00[lVar23] = iVar51;
              ptr_01[lVar23] = iVar51;
            }
            for (; (int)uVar27 < (int)uVar20; uVar27 = uVar27 + 1) {
              ptr_00[uVar27 + 0xf] = iVar51;
              ptr_01[uVar27 + 0xf] = iVar51;
            }
            uVar25 = _s1Len - 1;
            uVar27 = (ulong)uVar25;
            auVar64 = ZEXT3264(local_140);
            auVar62 = ZEXT3264(local_1c0);
            local_1e0._8_8_ = 0x80009000a000b;
            local_1e0._0_8_ = 0xc000d000e000f;
            local_1e0._16_8_ = 0x4000500060007;
            local_1e0._24_8_ = 0x100020003;
            local_160._2_2_ = iVar51;
            local_160._0_2_ = iVar51;
            local_160._4_2_ = iVar51;
            local_160._6_2_ = iVar51;
            local_160._8_2_ = iVar51;
            local_160._10_2_ = iVar51;
            local_160._12_2_ = iVar51;
            local_160._14_2_ = iVar51;
            local_160._16_2_ = iVar51;
            local_160._18_2_ = iVar51;
            local_160._20_2_ = iVar51;
            local_160._22_2_ = iVar51;
            local_160._24_2_ = iVar51;
            local_160._26_2_ = iVar51;
            local_160._28_2_ = iVar51;
            local_160._30_2_ = iVar51;
            auVar65 = ZEXT3264(local_160);
            local_180._2_2_ = sVar47;
            local_180._0_2_ = sVar47;
            local_180._4_2_ = sVar47;
            local_180._6_2_ = sVar47;
            local_180._10_2_ = sVar47;
            local_180._8_2_ = sVar47;
            local_180._12_2_ = sVar47;
            local_180._14_2_ = sVar47;
            local_180._18_2_ = sVar47;
            local_180._16_2_ = sVar47;
            local_180._20_2_ = sVar47;
            local_180._22_2_ = sVar47;
            local_180._26_2_ = sVar47;
            local_180._24_2_ = sVar47;
            local_180._28_2_ = sVar47;
            local_180._30_2_ = sVar47;
            for (uVar50 = 0; (long)uVar50 < lVar45; uVar50 = uVar50 + 0x10) {
              if (matrix->type == 0) {
                uVar15 = (uint)local_2a8[uVar50 + 1];
                uVar35 = (uint)local_2a8[uVar50 + 2];
                uVar16 = (uint)local_2a8[uVar50 + 3];
                uVar36 = (uint)local_2a8[uVar50 + 4];
                uVar37 = (uint)local_2a8[uVar50 + 5];
                uVar38 = (uint)local_2a8[uVar50 + 6];
                uVar39 = (uint)local_2a8[uVar50 + 7];
                uVar40 = (uint)local_2a8[uVar50 + 8];
                uVar41 = (uint)local_2a8[uVar50 + 9];
                uVar42 = (uint)local_2a8[uVar50 + 10];
                uVar17 = (uint)local_2a8[uVar50 + 0xb];
                uVar43 = (uint)local_2a8[uVar50 + 0xc];
                uVar44 = (uint)local_2a8[uVar50 + 0xd];
                uVar21 = (uint)local_2a8[uVar50 + 0xe];
                uVar49 = (ulong)(uint)(int)local_2a8[uVar50];
                uVar13 = (int)local_2a8[uVar50 + 0xf];
              }
              else {
                uVar13 = (uint)uVar50;
                uVar15 = uVar13 | 1;
                if (lVar45 <= (long)(uVar50 | 1)) {
                  uVar15 = uVar25;
                }
                uVar35 = uVar13 | 2;
                if (lVar45 <= (long)(uVar50 | 2)) {
                  uVar35 = uVar25;
                }
                uVar16 = uVar13 | 3;
                if (lVar45 <= (long)(uVar50 | 3)) {
                  uVar16 = uVar25;
                }
                uVar36 = uVar13 | 4;
                if (lVar45 <= (long)(uVar50 | 4)) {
                  uVar36 = uVar25;
                }
                uVar37 = uVar13 | 5;
                if (lVar45 <= (long)(uVar50 | 5)) {
                  uVar37 = uVar25;
                }
                uVar38 = uVar13 | 6;
                if (lVar45 <= (long)(uVar50 | 6)) {
                  uVar38 = uVar25;
                }
                uVar39 = uVar13 | 7;
                if (lVar45 <= (long)(uVar50 | 7)) {
                  uVar39 = uVar25;
                }
                uVar40 = uVar13 | 8;
                if (lVar45 <= (long)(uVar50 | 8)) {
                  uVar40 = uVar25;
                }
                uVar41 = uVar13 | 9;
                if (lVar45 <= (long)(uVar50 | 9)) {
                  uVar41 = uVar25;
                }
                uVar42 = uVar13 | 10;
                if (lVar45 <= (long)(uVar50 | 10)) {
                  uVar42 = uVar25;
                }
                uVar17 = uVar13 | 0xb;
                if (lVar45 <= (long)(uVar50 | 0xb)) {
                  uVar17 = uVar25;
                }
                uVar43 = uVar13 | 0xc;
                if (lVar45 <= (long)(uVar50 | 0xc)) {
                  uVar43 = uVar25;
                }
                uVar44 = uVar13 | 0xd;
                if (lVar45 <= (long)(uVar50 | 0xd)) {
                  uVar44 = uVar25;
                }
                uVar21 = uVar13 | 0xe;
                if (lVar45 <= (long)(uVar50 | 0xe)) {
                  uVar21 = uVar25;
                }
                uVar49 = uVar50;
                uVar13 = uVar13 | 0xf;
                if (lVar45 <= (long)(uVar50 | 0xf)) {
                  uVar13 = uVar25;
                }
              }
              local_2b0 = uVar50 | 6;
              local_2b8 = uVar50 | 7;
              local_2c0 = uVar50 | 8;
              local_2c8 = uVar50 | 9;
              local_2d0 = uVar50 | 10;
              local_300 = uVar50 | 1;
              local_308 = uVar50 | 2;
              local_310 = uVar50 | 4;
              local_318 = uVar50 | 5;
              local_388 = uVar50 | 3;
              uVar33 = uVar50 | 0xf;
              uVar32 = uVar50 | 0xe;
              uVar30 = uVar50 | 0xd;
              uVar28 = uVar50 | 0xc;
              uVar24 = uVar50 | 0xb;
              iVar18 = matrix->size;
              piVar3 = matrix->matrix;
              auVar11._2_2_ = local_100;
              auVar11._0_2_ = local_100;
              auVar11._4_2_ = local_100;
              auVar11._6_2_ = local_100;
              auVar11._8_2_ = local_100;
              auVar11._10_2_ = local_100;
              auVar11._12_2_ = local_100;
              auVar11._14_2_ = local_100;
              auVar11._16_2_ = local_100;
              auVar11._18_2_ = local_100;
              auVar11._20_2_ = local_100;
              auVar11._22_2_ = local_100;
              auVar11._24_2_ = local_100;
              auVar11._26_2_ = local_100;
              auVar11._28_2_ = local_100;
              auVar11._30_2_ = local_100;
              local_80 = vpcmpgtw_avx2(auVar11,local_1e0);
              auVar12._2_2_ = iVar51;
              auVar12._0_2_ = iVar51;
              auVar12._4_2_ = iVar51;
              auVar12._6_2_ = iVar51;
              auVar12._8_2_ = iVar51;
              auVar12._10_2_ = iVar51;
              auVar12._12_2_ = iVar51;
              auVar12._14_2_ = iVar51;
              auVar12._16_2_ = iVar51;
              auVar12._18_2_ = iVar51;
              auVar12._20_2_ = iVar51;
              auVar12._22_2_ = iVar51;
              auVar12._24_2_ = iVar51;
              auVar12._26_2_ = iVar51;
              auVar12._28_2_ = iVar51;
              auVar12._30_2_ = iVar51;
              auVar10 = vpmovsxbw_avx2(_DAT_008a5c84);
              auVar57 = local_e0;
              auVar11 = local_e0;
              auVar54 = auVar12;
              for (uVar34 = 0; (~((int)uVar20 >> 0x1f) & uVar20) != uVar34; uVar34 = uVar34 + 1) {
                auVar55 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar39 * iVar18) +
                                                           (long)ptr[uVar34 + 8]]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(uVar38 * iVar18) +
                                                       (long)ptr[uVar34 + 9]),1);
                auVar55 = vpinsrw_avx(auVar55,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar37 * iVar18) +
                                                               (long)ptr[uVar34 + 10]),2);
                auVar55 = vpinsrw_avx(auVar55,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar36 * iVar18) +
                                                               (long)ptr[uVar34 + 0xb]),3);
                auVar55 = vpinsrw_avx(auVar55,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar16 * iVar18) +
                                                               (long)ptr[uVar34 + 0xc]),4);
                auVar55 = vpinsrw_avx(auVar55,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar35 * iVar18) +
                                                               (long)ptr[uVar34 + 0xd]),5);
                auVar55 = vpinsrw_avx(auVar55,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar15 * iVar18) +
                                                               (long)ptr[uVar34 + 0xe]),6);
                auVar55 = vpinsrw_avx(auVar55,(uint)*(ushort *)
                                                     (piVar3 + (long)((int)uVar49 * iVar18) +
                                                               (long)ptr[uVar34 + 0xf]),7);
                auVar56 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar13 * iVar18) +
                                                           (long)ptr[uVar34]]),
                                      (uint)*(ushort *)
                                             (piVar3 + (long)(int)(uVar21 * iVar18) +
                                                       (long)ptr[uVar34 + 1]),1);
                auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar44 * iVar18) +
                                                               (long)ptr[uVar34 + 2]),2);
                auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar43 * iVar18) +
                                                               (long)ptr[uVar34 + 3]),3);
                auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar17 * iVar18) +
                                                               (long)ptr[uVar34 + 4]),4);
                auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar42 * iVar18) +
                                                               (long)ptr[uVar34 + 5]),5);
                auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar41 * iVar18) +
                                                               (long)ptr[uVar34 + 6]),6);
                auVar56 = vpinsrw_avx(auVar56,(uint)*(ushort *)
                                                     (piVar3 + (long)(int)(uVar40 * iVar18) +
                                                               (long)ptr[uVar34 + 7]),7);
                auVar60 = vpalignr_avx2(ZEXT1632(auVar11._16_16_),auVar11,2);
                iVar1 = ptr_00[uVar34 + 0xf];
                auVar59._2_2_ = iVar1;
                auVar59._0_2_ = iVar1;
                auVar59._4_2_ = iVar1;
                auVar59._6_2_ = iVar1;
                auVar59._8_2_ = iVar1;
                auVar59._10_2_ = iVar1;
                auVar59._12_2_ = iVar1;
                auVar59._14_2_ = iVar1;
                auVar59._16_2_ = iVar1;
                auVar59._18_2_ = iVar1;
                auVar59._20_2_ = iVar1;
                auVar59._22_2_ = iVar1;
                auVar59._24_2_ = iVar1;
                auVar59._26_2_ = iVar1;
                auVar59._28_2_ = iVar1;
                auVar59._30_2_ = iVar1;
                auVar59 = vpblendw_avx2(auVar60,auVar59,0x80);
                auVar59 = vpblendd_avx2(auVar60,auVar59,0xf0);
                iVar1 = ptr_01[uVar34 + 0xf];
                auVar60._2_2_ = iVar1;
                auVar60._0_2_ = iVar1;
                auVar60._4_2_ = iVar1;
                auVar60._6_2_ = iVar1;
                auVar60._8_2_ = iVar1;
                auVar60._10_2_ = iVar1;
                auVar60._12_2_ = iVar1;
                auVar60._14_2_ = iVar1;
                auVar60._16_2_ = iVar1;
                auVar60._18_2_ = iVar1;
                auVar60._20_2_ = iVar1;
                auVar60._22_2_ = iVar1;
                auVar60._24_2_ = iVar1;
                auVar60._26_2_ = iVar1;
                auVar60._28_2_ = iVar1;
                auVar60._30_2_ = iVar1;
                auVar54 = vpalignr_avx2(ZEXT1632(auVar54._16_16_),auVar54,2);
                auVar60 = vpblendw_avx2(auVar54,auVar60,0x80);
                auVar60 = vpblendd_avx2(auVar54,auVar60,0xf0);
                auVar8._2_2_ = local_a0;
                auVar8._0_2_ = local_a0;
                auVar8._4_2_ = local_a0;
                auVar8._6_2_ = local_a0;
                auVar8._8_2_ = local_a0;
                auVar8._10_2_ = local_a0;
                auVar8._12_2_ = local_a0;
                auVar8._14_2_ = local_a0;
                auVar8._16_2_ = local_a0;
                auVar8._18_2_ = local_a0;
                auVar8._20_2_ = local_a0;
                auVar8._22_2_ = local_a0;
                auVar8._24_2_ = local_a0;
                auVar8._26_2_ = local_a0;
                auVar8._28_2_ = local_a0;
                auVar8._30_2_ = local_a0;
                auVar54 = vpsubsw_avx2(auVar59,auVar8);
                auVar60 = vpsubsw_avx2(auVar60,auVar53);
                auVar54 = vpmaxsw_avx2(auVar54,auVar60);
                auVar11 = vpsubsw_avx2(auVar11,auVar8);
                auVar12 = vpsubsw_avx2(auVar12,auVar53);
                auVar60 = vpmaxsw_avx2(auVar11,auVar12);
                auVar61._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar56;
                auVar61._16_16_ = ZEXT116(1) * auVar55;
                auVar11 = vpaddsw_avx2(auVar57,auVar61);
                auVar12 = vpmaxsw_avx2(auVar60,auVar54);
                auVar12 = vpmaxsw_avx2(auVar12,_DAT_008a5840);
                auVar57 = vpmaxsw_avx2(auVar11,auVar12);
                auVar12 = vpcmpeqw_avx2(auVar10,_DAT_008a5a80);
                auVar11 = vpandn_avx2(auVar12,auVar57);
                if (0xf < uVar34) {
                  local_180 = vpminsw_avx2(local_180,auVar11);
                  local_160 = vpmaxsw_avx2(local_160,auVar11);
                }
                piVar4 = ((ppVar19->field_4).rowcols)->score_row;
                piVar5 = ((ppVar19->field_4).rowcols)->score_col;
                auVar55 = auVar11._0_16_;
                auVar56 = auVar11._16_16_;
                if (uVar50 == uVar27 && uVar34 < uVar46) {
                  iVar48 = vpextrw_avx(auVar56,7);
                  piVar4[uVar34] = iVar48;
                }
                if (s2Len - 1 == uVar34) {
                  iVar48 = vpextrw_avx(auVar56,7);
                  piVar5[uVar50] = iVar48;
                }
                if (uVar34 - 1 < uVar46 && local_300 == uVar27) {
                  iVar48 = vpextrw_avx(auVar56,6);
                  piVar4[uVar34 - 1] = iVar48;
                }
                if (uVar46 == uVar34 && (long)local_300 < lVar45) {
                  iVar48 = vpextrw_avx(auVar56,6);
                  piVar5[local_300] = iVar48;
                }
                if ((local_308 == uVar27) && ((long)(uVar34 - 2) < (long)uVar46 && 1 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar56,5);
                  piVar4[uVar34 - 2] = iVar48;
                }
                if (uVar46 + 1 == uVar34 && (long)local_308 < lVar45) {
                  iVar48 = vpextrw_avx(auVar56,5);
                  piVar5[local_308] = iVar48;
                }
                if ((local_388 == uVar27) && ((long)(uVar34 - 3) < (long)uVar46 && 2 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar56,4);
                  piVar4[uVar34 - 3] = iVar48;
                }
                if (uVar46 + 2 == uVar34 && (long)local_388 < lVar45) {
                  iVar48 = vpextrw_avx(auVar56,4);
                  piVar5[local_388] = iVar48;
                }
                if ((local_310 == uVar27) && ((long)(uVar34 - 4) < (long)uVar46 && 3 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar56,3);
                  piVar4[uVar34 - 4] = iVar48;
                }
                if (uVar46 + 3 == uVar34 && (long)local_310 < lVar45) {
                  iVar48 = vpextrw_avx(auVar56,3);
                  piVar5[local_310] = iVar48;
                }
                if ((local_318 == uVar27) && ((long)(uVar34 - 5) < (long)uVar46 && 4 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar56,2);
                  piVar4[uVar34 - 5] = iVar48;
                }
                if (uVar46 + 4 == uVar34 && (long)local_318 < lVar45) {
                  iVar48 = vpextrw_avx(auVar56,2);
                  piVar5[local_318] = iVar48;
                }
                if ((local_2b0 == uVar27) && ((long)(uVar34 - 6) < (long)uVar46 && 5 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar56,1);
                  piVar4[uVar34 - 6] = iVar48;
                }
                if (uVar46 + 5 == uVar34 && (long)local_2b0 < lVar45) {
                  iVar48 = vpextrw_avx(auVar56,1);
                  piVar5[local_2b0] = iVar48;
                }
                if ((local_2b8 == uVar27) && ((long)(uVar34 - 7) < (long)uVar46 && 6 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar56,0);
                  piVar4[uVar34 - 7] = iVar48;
                }
                if (uVar46 + 6 == uVar34 && (long)local_2b8 < lVar45) {
                  iVar48 = vpextrw_avx(auVar56,0);
                  piVar5[local_2b8] = iVar48;
                }
                if ((local_2c0 == uVar27) && ((long)(uVar34 - 8) < (long)uVar46 && 7 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar55,7);
                  piVar4[uVar34 - 8] = iVar48;
                }
                if (uVar46 + 7 == uVar34 && (long)local_2c0 < lVar45) {
                  iVar48 = vpextrw_avx(auVar55,7);
                  piVar5[local_2c0] = iVar48;
                }
                if ((local_2c8 == uVar27) && ((long)(uVar34 - 9) < (long)uVar46 && 8 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar55,6);
                  piVar4[uVar34 - 9] = iVar48;
                }
                if (uVar46 + 8 == uVar34 && (long)local_2c8 < lVar45) {
                  iVar48 = vpextrw_avx(auVar55,6);
                  piVar5[local_2c8] = iVar48;
                }
                if ((local_2d0 == uVar27) && ((long)(uVar34 - 10) < (long)uVar46 && 9 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar55,5);
                  piVar4[uVar34 - 10] = iVar48;
                }
                if (uVar46 + 9 == uVar34 && (long)local_2d0 < lVar45) {
                  iVar48 = vpextrw_avx(auVar55,5);
                  piVar5[local_2d0] = iVar48;
                }
                if ((uVar24 == uVar27) && ((long)(uVar34 - 0xb) < (long)uVar46 && 10 < uVar34)) {
                  iVar48 = vpextrw_avx(auVar55,4);
                  piVar4[uVar34 - 0xb] = iVar48;
                }
                if (uVar46 + 10 == uVar34 && (long)uVar24 < lVar45) {
                  iVar48 = vpextrw_avx(auVar55,4);
                  piVar5[uVar24] = iVar48;
                }
                if ((uVar28 == uVar27) && ((long)(uVar34 - 0xc) < (long)uVar46 && 0xb < uVar34)) {
                  iVar48 = vpextrw_avx(auVar55,3);
                  piVar4[uVar34 - 0xc] = iVar48;
                }
                if (uVar46 + 0xb == uVar34 && (long)uVar28 < lVar45) {
                  iVar48 = vpextrw_avx(auVar55,3);
                  piVar5[uVar28] = iVar48;
                }
                if ((uVar30 == uVar27) && ((long)(uVar34 - 0xd) < (long)uVar46 && 0xc < uVar34)) {
                  iVar48 = vpextrw_avx(auVar55,2);
                  piVar4[uVar34 - 0xd] = iVar48;
                }
                if (uVar46 + 0xc == uVar34 && (long)uVar30 < lVar45) {
                  iVar48 = vpextrw_avx(auVar55,2);
                  piVar5[uVar30] = iVar48;
                }
                if ((uVar32 == uVar27) && ((long)(uVar34 - 0xe) < (long)uVar46 && 0xd < uVar34)) {
                  iVar48 = vpextrw_avx(auVar55,1);
                  piVar4[uVar34 - 0xe] = iVar48;
                }
                if (uVar46 + 0xd == uVar34 && (long)uVar32 < lVar45) {
                  iVar48 = vpextrw_avx(auVar55,1);
                  piVar5[uVar32] = iVar48;
                }
                if (0xe < uVar34 && uVar33 == uVar27) {
                  iVar48 = vpextrw_avx(auVar55,0);
                  piVar4[uVar34 - 0xf] = iVar48;
                }
                auVar7._2_2_ = iVar51;
                auVar7._0_2_ = iVar51;
                auVar7._4_2_ = iVar51;
                auVar7._6_2_ = iVar51;
                auVar7._8_2_ = iVar51;
                auVar7._10_2_ = iVar51;
                auVar7._12_2_ = iVar51;
                auVar7._14_2_ = iVar51;
                auVar7._16_2_ = iVar51;
                auVar7._18_2_ = iVar51;
                auVar7._20_2_ = iVar51;
                auVar7._22_2_ = iVar51;
                auVar7._24_2_ = iVar51;
                auVar7._26_2_ = iVar51;
                auVar7._28_2_ = iVar51;
                auVar7._30_2_ = iVar51;
                auVar54 = vpblendvb_avx2(auVar54,auVar7,auVar12);
                if (uVar46 + 0xe == uVar34 && (long)uVar33 < lVar45) {
                  piVar5[uVar33] = auVar11._0_4_ & 0xffff;
                }
                auVar9._2_2_ = local_c0;
                auVar9._0_2_ = local_c0;
                auVar9._4_2_ = local_c0;
                auVar9._6_2_ = local_c0;
                auVar9._8_2_ = local_c0;
                auVar9._10_2_ = local_c0;
                auVar9._12_2_ = local_c0;
                auVar9._14_2_ = local_c0;
                auVar9._16_2_ = local_c0;
                auVar9._18_2_ = local_c0;
                auVar9._20_2_ = local_c0;
                auVar9._22_2_ = local_c0;
                auVar9._24_2_ = local_c0;
                auVar9._26_2_ = local_c0;
                auVar9._28_2_ = local_c0;
                auVar9._30_2_ = local_c0;
                auVar8 = vpcmpgtw_avx2(auVar9,auVar10);
                auVar8 = vpand_avx2(auVar8,local_80);
                auVar61 = vpsraw_avx2(auVar10,0xf);
                auVar61 = vpandn_avx2(auVar61,auVar8);
                auVar55 = vpacksswb_avx(auVar61._0_16_,auVar61._16_16_);
                auVar63 = auVar64._0_32_;
                auVar7 = vpcmpeqw_avx2(auVar63,auVar11);
                auVar9 = vpcmpgtw_avx2(auVar11,auVar63);
                auVar8 = vpand_avx2(auVar9,auVar61);
                auVar57 = vpblendvb_avx2(auVar63,auVar57,auVar8);
                auVar64 = ZEXT3264(auVar57);
                auVar56 = vpacksswb_avx(auVar8._0_16_,auVar8._16_16_);
                auVar57 = vpcmpgtw_avx2(auVar62._0_32_,auVar10);
                auVar57 = vpand_avx2(auVar7,auVar57);
                auVar6 = vpacksswb_avx(auVar57._0_16_,auVar57._16_16_);
                auVar55 = vpblendvb_avx(auVar56,auVar55,auVar6);
                auVar63._2_2_ = iVar51;
                auVar63._0_2_ = iVar51;
                auVar63._4_2_ = iVar51;
                auVar63._6_2_ = iVar51;
                auVar63._8_2_ = iVar51;
                auVar63._10_2_ = iVar51;
                auVar63._12_2_ = iVar51;
                auVar63._14_2_ = iVar51;
                auVar63._16_2_ = iVar51;
                auVar63._18_2_ = iVar51;
                auVar63._20_2_ = iVar51;
                auVar63._22_2_ = iVar51;
                auVar63._24_2_ = iVar51;
                auVar63._26_2_ = iVar51;
                auVar63._28_2_ = iVar51;
                auVar63._30_2_ = iVar51;
                auVar12 = vpblendvb_avx2(auVar60,auVar63,auVar12);
                auVar60 = vpmovsxbw_avx2(auVar55);
                auVar60 = vpblendvb_avx2(auVar65._0_32_,local_1e0,auVar60);
                auVar65 = ZEXT3264(auVar60);
                auVar57 = vpor_avx2(auVar57,auVar9);
                auVar57 = vpand_avx2(auVar61,auVar57);
                auVar58._8_2_ = 1;
                auVar58._0_8_ = 0x1000100010001;
                auVar58._10_2_ = 1;
                auVar58._12_2_ = 1;
                auVar58._14_2_ = 1;
                auVar58._16_2_ = 1;
                auVar58._18_2_ = 1;
                auVar58._20_2_ = 1;
                auVar58._22_2_ = 1;
                auVar58._24_2_ = 1;
                auVar58._26_2_ = 1;
                auVar58._28_2_ = 1;
                auVar58._30_2_ = 1;
                auVar57 = vpblendvb_avx2(auVar62._0_32_,auVar10,auVar57);
                auVar62 = ZEXT3264(auVar57);
                auVar10 = vpaddsw_avx2(auVar10,auVar58);
                ptr_00[uVar34] = auVar11._0_2_;
                vpextrw_avx(auVar54._0_16_,0);
                auVar57 = auVar59;
              }
              auVar54._8_2_ = 0x10;
              auVar54._0_8_ = 0x10001000100010;
              auVar54._10_2_ = 0x10;
              auVar54._12_2_ = 0x10;
              auVar54._14_2_ = 0x10;
              auVar54._16_2_ = 0x10;
              auVar54._18_2_ = 0x10;
              auVar54._20_2_ = 0x10;
              auVar54._22_2_ = 0x10;
              auVar54._24_2_ = 0x10;
              auVar54._26_2_ = 0x10;
              auVar54._28_2_ = 0x10;
              auVar54._30_2_ = 0x10;
              local_1e0 = vpaddsw_avx2(local_1e0,auVar54);
            }
            local_140 = auVar64._0_32_;
            local_1c0 = auVar62._0_32_;
            local_1a0 = auVar65._0_32_;
            iVar48 = 0;
            iVar18 = 0;
            for (lVar45 = 0; uVar31 = (ushort)uVar26, (int)lVar45 != 0x10; lVar45 = lVar45 + 1) {
              uVar2 = *(ushort *)(local_140 + lVar45 * 2);
              if ((short)uVar31 < (short)uVar2) {
                iVar18 = (int)*(short *)(local_1a0 + lVar45 * 2);
                iVar48 = (int)*(short *)(local_1c0 + lVar45 * 2);
                uVar26 = (uint)uVar2;
              }
              else if (uVar2 == uVar31) {
                iVar29 = (int)*(short *)(local_1c0 + lVar45 * 2);
                if (iVar29 < iVar48) {
                  iVar18 = (int)*(short *)(local_1a0 + lVar45 * 2);
                  iVar48 = iVar29;
                }
                else if ((iVar48 == iVar29) && (*(short *)(local_1a0 + lVar45 * 2) <= iVar18)) {
                  iVar18 = (int)*(short *)(local_1a0 + lVar45 * 2);
                }
              }
            }
            auVar57._2_2_ = iVar51;
            auVar57._0_2_ = iVar51;
            auVar57._4_2_ = iVar51;
            auVar57._6_2_ = iVar51;
            auVar57._8_2_ = iVar51;
            auVar57._10_2_ = iVar51;
            auVar57._12_2_ = iVar51;
            auVar57._14_2_ = iVar51;
            auVar57._16_2_ = iVar51;
            auVar57._18_2_ = iVar51;
            auVar57._20_2_ = iVar51;
            auVar57._22_2_ = iVar51;
            auVar57._24_2_ = iVar51;
            auVar57._26_2_ = iVar51;
            auVar57._28_2_ = iVar51;
            auVar57._30_2_ = iVar51;
            auVar10 = vpcmpgtw_avx2(auVar57,local_180);
            auVar14._2_2_ = sVar47;
            auVar14._0_2_ = sVar47;
            auVar14._4_2_ = sVar47;
            auVar14._6_2_ = sVar47;
            auVar14._8_2_ = sVar47;
            auVar14._10_2_ = sVar47;
            auVar14._12_2_ = sVar47;
            auVar14._14_2_ = sVar47;
            auVar14._16_2_ = sVar47;
            auVar14._18_2_ = sVar47;
            auVar14._20_2_ = sVar47;
            auVar14._22_2_ = sVar47;
            auVar14._24_2_ = sVar47;
            auVar14._26_2_ = sVar47;
            auVar14._28_2_ = sVar47;
            auVar14._30_2_ = sVar47;
            auVar53 = vpcmpgtw_avx2(local_160,auVar14);
            auVar10 = vpor_avx2(auVar10,auVar53);
            if ((((((((((((((((((((((((((((((((auVar10 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar10 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar10 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar10 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar10 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar10 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar10 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar10 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar10 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar10 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar10 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar10 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar10 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar10 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar10 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar10 >> 0x7f,0) != '\0') ||
                              (auVar10 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar10 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar10 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar10 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar10 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar10 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar10 >> 0xbf,0) != '\0') ||
                      (auVar10 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar10 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar10 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar10 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar10 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar10[0x1f] < '\0') {
              *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
              uVar31 = 0;
              iVar48 = 0;
              iVar18 = 0;
            }
            ppVar19->score = (int)(short)uVar31;
            ppVar19->end_query = iVar18;
            ppVar19->end_ref = iVar48;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_2a8);
              return ppVar19;
            }
            return ppVar19;
          }
        }
        return (parasail_result_t *)0x0;
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar22 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_007b35b8;
        __format = "%s: %s must be > 0\n";
        pcVar22 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_rowcol_diag_avx2_256_16",pcVar22);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}